

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O1

char * preprocess(char *source)

{
  byte bVar1;
  char cVar2;
  char **ppcVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  void *__ptr;
  FILE *source_00;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  int local_4c;
  char *local_48;
  int local_40;
  uint local_3c;
  char *local_38;
  
  local_4c = 0;
  inprocess = inprocess + 1;
  pcVar5 = (char *)malloc(1);
  *pcVar5 = '\0';
  if (*source == '\0') {
    bVar14 = true;
  }
  else {
    local_3c = 0;
    local_40 = 0;
    local_48 = pcVar5;
    local_38 = source;
    do {
      pcVar6 = readline(source,&local_4c);
      local_3c = local_3c + 1;
      sVar7 = strlen(pcVar6);
      pcVar5 = local_48;
      uVar4 = (uint)sVar7;
      if ((int)uVar4 < 7) {
LAB_00107056:
        if ((int)uVar4 < 1) {
          uVar11 = 0;
        }
        else {
          uVar11 = 0;
          do {
            if ((pcVar6[uVar11] != ' ') && (pcVar6[uVar11] != '\t')) goto LAB_001070c7;
            uVar11 = uVar11 + 1;
          } while ((uVar4 & 0x7fffffff) != uVar11);
          uVar11 = sVar7 & 0xffffffff;
        }
LAB_001070c7:
        if ((uint)uVar11 != uVar4) {
          cVar2 = pcVar6[uVar11 & 0xffffffff];
          if (((cVar2 != '\n') && (cVar2 != '\r')) &&
             ((iVar10 = uVar4 - 1, cVar2 != '/' || iVar10 <= (int)(uint)uVar11 ||
              (pcVar6[(uVar11 & 0xffffffff) + 1] != '/')))) {
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            else {
              uVar11 = 0;
              do {
                if ((pcVar6[uVar11] != ' ') && (pcVar6[uVar11] != '\t')) {
                  uVar4 = (uint)uVar11;
                  break;
                }
                uVar11 = uVar11 + 1;
              } while ((uVar4 & 0x7fffffff) != uVar11);
            }
            if ((((int)uVar4 < iVar10) && (pcVar6[uVar4] == '/')) &&
               (pcVar6[(ulong)uVar4 + 1] == '*')) {
              while( true ) {
                sVar7 = strlen(pcVar6);
                iVar10 = (int)sVar7;
                if (((2 < iVar10) && (pcVar6[iVar10 - 2] == '/')) &&
                   (pcVar5 = pcVar6, pcVar6[iVar10 - 3] == '*')) break;
                free(pcVar6);
                pcVar6 = readline(source,&local_4c);
              }
            }
            else {
              pcVar9 = str_append(local_48,pcVar6);
              free(pcVar5);
              pcVar5 = pcVar6;
              local_48 = pcVar9;
            }
            goto LAB_001072d8;
          }
        }
      }
      else {
        lVar13 = 0;
        do {
          if (pcVar6[lVar13] != "Include"[lVar13]) goto LAB_00107056;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 7);
        __ptr = (void *)0x0;
        sVar7 = 0;
        while( true ) {
          bVar1 = pcVar6[sVar7 + 8];
          if ((bVar1 < 0xe) && ((0x2401U >> (bVar1 & 0x1f) & 1) != 0)) break;
          __ptr = realloc(__ptr,sVar7 + 1);
          *(byte *)((long)__ptr + sVar7) = bVar1;
          sVar7 = sVar7 + 1;
        }
        pcVar5 = (char *)realloc(__ptr,(ulong)((int)sVar7 + 1));
        pcVar5[sVar7] = '\0';
        ppcVar3 = inclusionTable;
        lVar13 = (long)count;
        if (0 < lVar13) {
          lVar12 = 0;
          do {
            iVar10 = strcmp(ppcVar3[lVar12],pcVar5);
            if (iVar10 == 0) {
              printf("\x1b[32m\n[Debug] [Preprocessor] Skipping duplicate inclusion of %s\x1b[0m",
                     pcVar5);
              free(pcVar5);
              pcVar5 = pcVar6;
              source = local_38;
              goto LAB_001072d8;
            }
            lVar12 = lVar12 + 1;
          } while (lVar13 != lVar12);
        }
        source_00 = fopen(pcVar5,"rb");
        if (source_00 == (FILE *)0x0) {
          printf("\x1b[33m\n[Warning] [Line %d] Unable to open file for inclusion : %s\x1b[0m",
                 (ulong)local_3c,pcVar5);
          source = local_38;
        }
        else {
          local_40 = local_40 + 1;
          pcVar9 = read_all((FILE *)source_00);
          lVar13 = (long)count;
          count = count + 1;
          inclusionTable = (char **)realloc(inclusionTable,lVar13 * 8 + 8);
          pcVar6 = local_48;
          inclusionTable[lVar13] = pcVar5;
          pcVar8 = str_append(local_48,pcVar9);
          free(pcVar9);
          free(pcVar6);
          source = local_38;
          local_48 = pcVar8;
        }
LAB_001072d8:
        free(pcVar5);
      }
    } while (source[local_4c] != '\0');
    bVar14 = local_40 == 0;
    pcVar5 = local_48;
  }
  free(source);
  if (!bVar14) {
    pcVar5 = preprocess(pcVar5);
  }
  ppcVar3 = inclusionTable;
  inprocess = inprocess + -1;
  if (inprocess == 0) {
    lVar13 = (long)count;
    if (lVar13 < 1) {
      lVar12 = 0;
    }
    else {
      lVar12 = 0;
      do {
        free(ppcVar3[lVar12]);
        lVar12 = lVar12 + 1;
      } while (lVar13 != lVar12);
    }
    local_4c = (int)lVar12;
    free(inclusionTable);
  }
  return pcVar5;
}

Assistant:

char* preprocess(char *source){
    int i = 0, lcount = 0, hasInclude = 0;
    inprocess++;
    char *result = (char *)mallocate(sizeof(char) * 1), *bak = NULL;
    result[0] = '\0';
    while(source[i] != '\0'){
        char *line = readline(source, &i);
     //   printf(debug("Line : [%s]"), line);
        lcount++;
        if(startsWith(line, "Include")){
            char *toInclude = str_part(line, 8); // Include
            if(has_in_table(toInclude)){
                printf(debug("[Preprocessor] Skipping duplicate inclusion of %s"), toInclude);
                memfree(toInclude);
                memfree(line);
                continue;
            }
            FILE *include = fopen(toInclude, "rb");
            if(include == NULL)
                printf(warning("[Line %d] Unable to open file for inclusion : %s"), lcount, toInclude);
            else{
                hasInclude++;
                char *content = read_all(include);
                add_to_table(toInclude);
                bak = result;
                result = str_append(result, content);
                memfree(content);
                memfree(bak);
            }
            memfree(toInclude);
        }
        else if(!isEmpty(line)){
            if(is_start_of_mc(line)){
                while(!is_end_of_mc(line)){
                    memfree(line);
                    line = readline(source, &i);
                }
                memfree(line);
            }
            else{
                bak = result;
                result = str_append(result, line);
                memfree(bak);
                memfree(line);
            }
        }
       // memfree(line);
    }
    memfree(source);
    if(hasInclude){
        result = preprocess(result);
    }
    inprocess--;
    if(inprocess == 0){
        i = 0;
        while(i < count){
            memfree(inclusionTable[i]);
            i++;
        }
        memfree(inclusionTable);
    }
    return result;
}